

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
::AddKel(TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
         *this,TPZFMatrix<std::complex<double>_> *elmat,TPZVec<long> *sourceindex,
        TPZVec<long> *destinationindex)

{
  DecomposeType DVar1;
  TPZFrontSym<std::complex<double>_> *this_00;
  TPZBaseMatrix *in_RDI;
  TPZEqnArray<std::complex<double>_> AuxEqn;
  int64_t maxeq;
  int64_t mineq;
  undefined4 in_stack_ffffffffffffadd0;
  TPZEqnArray<std::complex<double>_> *in_stack_ffffffffffffadd8;
  TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  *in_stack_ffffffffffffade0;
  TPZFrontSym<std::complex<double>_> *in_stack_ffffffffffffadf0;
  TPZVec<long> *in_stack_ffffffffffffadf8;
  TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  *in_stack_ffffffffffffae00;
  TPZVec<long> *in_stack_ffffffffffffae08;
  TPZVec<long> *in_stack_ffffffffffffae10;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffae18;
  TPZFrontSym<std::complex<double>_> *in_stack_ffffffffffffae20;
  TPZEqnArray<std::complex<double>_> *in_stack_ffffffffffffffb8;
  TPZStackEqnStorage<std::complex<double>_> *in_stack_ffffffffffffffc0;
  undefined1 *local_30;
  long local_28;
  
  TPZFrontSym<std::complex<double>_>::AddKel
            (in_stack_ffffffffffffae20,in_stack_ffffffffffffae18,in_stack_ffffffffffffae10,
             in_stack_ffffffffffffae08);
  EquationsToDecompose
            (in_stack_ffffffffffffae00,in_stack_ffffffffffffadf8,
             (int64_t *)in_stack_ffffffffffffadf0,(int64_t *)in_RDI);
  TPZEqnArray<std::complex<double>_>::TPZEqnArray
            ((TPZEqnArray<std::complex<double>_> *)in_stack_ffffffffffffae00);
  if (local_28 <= (long)local_30) {
    TPZFrontSym<std::complex<double>_>::DecomposeEquations
              (in_stack_ffffffffffffadf0,(int64_t)in_RDI,(int64_t)in_stack_ffffffffffffade0,
               in_stack_ffffffffffffadd8);
    CheckCompress(in_stack_ffffffffffffade0);
    TPZStackEqnStorage<std::complex<double>_>::AddEqnArray
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    this_00 = (TPZFrontSym<std::complex<double>_> *)TPZBaseMatrix::Rows(in_RDI);
    if (local_30 ==
        (undefined1 *)((long)&this_00[-1].super_TPZFront<std::complex<double>_>.fProductMTData + 7))
    {
      TPZFrontSym<std::complex<double>_>::Reset(this_00,(int64_t)local_30);
      TPZStackEqnStorage<std::complex<double>_>::FinishWriting
                ((TPZStackEqnStorage<std::complex<double>_> *)(in_RDI + 1));
      TPZStackEqnStorage<std::complex<double>_>::ReOpen
                ((TPZStackEqnStorage<std::complex<double>_> *)(in_RDI + 1));
    }
  }
  DVar1 = TPZFrontSym<std::complex<double>_>::GetDecomposeType
                    ((TPZFrontSym<std::complex<double>_> *)&in_RDI[0x1993].fRow);
  in_RDI->fDecomposed = (char)DVar1;
  TPZEqnArray<std::complex<double>_>::~TPZEqnArray
            ((TPZEqnArray<std::complex<double>_> *)CONCAT44(DVar1,in_stack_ffffffffffffadd0));
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & sourceindex, TPZVec < int64_t > & destinationindex)
{
	fFront.AddKel(elmat, sourceindex, destinationindex);
#ifdef PZ_LOG
    if (loggerfw.isInfoEnabled())
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< fFront.FrontSize();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif
	
	int64_t mineq, maxeq;
	EquationsToDecompose(destinationindex, mineq, maxeq);
	TPZEqnArray<TVar> AuxEqn;
	if(maxeq >= mineq) {
		fFront.DecomposeEquations(mineq,maxeq,AuxEqn);
		CheckCompress();
		fStorage.AddEqnArray(&AuxEqn);
		if(maxeq == this->Rows()-1){
			fFront.Reset(0);
			fStorage.FinishWriting();
			fStorage.ReOpen();
		}
	}
	this->fDecomposed = fFront.GetDecomposeType();
}